

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O0

int Int_ManProofTraceOne(Int_Man_t *p,Sto_Cls_t *pConflict,Sto_Cls_t *pFinal)

{
  char *pcVar1;
  Sto_Cls_t *pCls;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  lit lVar6;
  int iVar7;
  abctime aVar8;
  uint *puVar9;
  uint *puVar10;
  abctime aVar11;
  int local_58;
  int local_54;
  int v2_1;
  int v1_1;
  int v2;
  int v1;
  abctime clk;
  uint local_38;
  int fPrint;
  int PrevId;
  int Var;
  int v;
  int i;
  Sto_Cls_t *pReason;
  Sto_Cls_t *pFinal_local;
  Sto_Cls_t *pConflict_local;
  Int_Man_t *p_local;
  
  aVar8 = Abc_Clock();
  if (p->fProofVerif != 0) {
    if (p->nResLitsAlloc < (int)(*(uint *)&pConflict->field_0x1c >> 3 & 0xffffff)) {
      __assert_fail("(int)pConflict->nLits <= p->nResLitsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                    ,599,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    memcpy(p->pResLits,pConflict + 1,(ulong)(*(uint *)&pConflict->field_0x1c >> 3 & 0xffffff) << 2);
    p->nResLits = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
  }
  for (PrevId = 0; PrevId < (int)(*(uint *)&pConflict->field_0x1c >> 3 & 0xffffff);
      PrevId = PrevId + 1) {
    pcVar1 = p->pSeens;
    iVar2 = lit_var(*(lit *)((long)&pConflict[1].pNext + (long)PrevId * 4));
    pcVar1[iVar2] = '\x01';
  }
  if (p->pCnf->nClausesA != 0) {
    puVar9 = Int_ManTruthRead(p,pFinal);
    puVar10 = Int_ManTruthRead(p,pConflict);
    Int_ManTruthCopy(puVar9,puVar10,p->nWords);
  }
  local_38 = Int_ManProofGet(p,pConflict);
  Var = p->nTrailSize;
  while (Var = Var + -1, -1 < Var) {
    uVar3 = lit_var(p->pTrail[Var]);
    if (p->pSeens[(int)uVar3] != '\0') {
      p->pSeens[(int)uVar3] = '\0';
      pCls = p->pReasons[(int)uVar3];
      if (pCls != (Sto_Cls_t *)0x0) {
        if (p->pTrail[Var] != *(int *)&pCls[1].pNext) {
          __assert_fail("p->pTrail[i] == pReason->pLits[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                        ,0x275,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
        }
        for (PrevId = 1; PrevId < (int)(*(uint *)&pCls->field_0x1c >> 3 & 0xffffff);
            PrevId = PrevId + 1) {
          pcVar1 = p->pSeens;
          iVar2 = lit_var(*(lit *)((long)&pCls[1].pNext + (long)PrevId * 4));
          pcVar1[iVar2] = '\x01';
        }
        iVar2 = Int_ManProofGet(p,pCls);
        if (iVar2 < 1) {
          __assert_fail("Int_ManProofGet(p, pReason) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                        ,0x27d,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
        }
        p->Counter = p->Counter + 1;
        if (p->fProofWrite != 0) {
          __stream = (FILE *)p->pFile;
          uVar5 = p->Counter;
          uVar4 = Int_ManProofGet(p,pCls);
          fprintf(__stream,"%d * %d %d 0\n",(ulong)uVar5,(ulong)local_38,(ulong)uVar4);
        }
        local_38 = p->Counter;
        if (p->pCnf->nClausesA != 0) {
          if (p->pVarTypes[(int)uVar3] == 1) {
            puVar9 = Int_ManTruthRead(p,pFinal);
            puVar10 = Int_ManTruthRead(p,pCls);
            Int_ManTruthOr(puVar9,puVar10,p->nWords);
          }
          else {
            puVar9 = Int_ManTruthRead(p,pFinal);
            puVar10 = Int_ManTruthRead(p,pCls);
            Int_ManTruthAnd(puVar9,puVar10,p->nWords);
          }
        }
        if (p->fProofVerif != 0) {
          v1_1 = 0;
          while ((v1_1 < p->nResLits && (uVar5 = lit_var(p->pResLits[v1_1]), uVar5 != uVar3))) {
            v1_1 = v1_1 + 1;
          }
          if (v1_1 == p->nResLits) {
            printf("Recording clause %d: Cannot find variable %d in the temporary resolvent.\n",
                   (ulong)(uint)pFinal->Id,(ulong)uVar3);
          }
          iVar2 = p->pResLits[v1_1];
          lVar6 = lit_neg(*(lit *)&pCls[1].pNext);
          if (iVar2 != lVar6) {
            printf("Recording clause %d: The resolved variable %d is in the wrong polarity.\n",
                   (ulong)(uint)pFinal->Id,(ulong)uVar3);
          }
          uVar5 = lit_var(p->pResLits[v1_1]);
          if (uVar5 != uVar3) {
            __assert_fail("lit_var(p->pResLits[v1]) == Var",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                          ,0x29a,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
          }
          p->nResLits = p->nResLits + -1;
          for (; v1_1 < p->nResLits; v1_1 = v1_1 + 1) {
            p->pResLits[v1_1] = p->pResLits[v1_1 + 1];
          }
          for (v2_1 = 1; v2_1 < (int)(*(uint *)&pCls->field_0x1c >> 3 & 0xffffff); v2_1 = v2_1 + 1)
          {
            for (v1_1 = 0; v1_1 < p->nResLits; v1_1 = v1_1 + 1) {
              iVar2 = lit_var(p->pResLits[v1_1]);
              iVar7 = lit_var(*(lit *)((long)&pCls[1].pNext + (long)v2_1 * 4));
              if (iVar2 == iVar7) break;
            }
            if (v1_1 == p->nResLits) {
              if (p->nResLits == p->nResLitsAlloc) {
                printf("Recording clause %d: Ran out of space for intermediate resolvent.\n",
                       (ulong)(uint)pFinal->Id);
              }
              lVar6 = *(lit *)((long)&pCls[1].pNext + (long)v2_1 * 4);
              iVar2 = p->nResLits;
              p->nResLits = iVar2 + 1;
              p->pResLits[iVar2] = lVar6;
            }
            else if (p->pResLits[v1_1] != *(int *)((long)&pCls[1].pNext + (long)v2_1 * 4)) {
              printf("Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n"
                     ,(ulong)(uint)pFinal->Id);
            }
          }
        }
      }
    }
  }
  if (p->fProofVerif != 0) {
    for (local_54 = 0; local_54 < p->nResLits; local_54 = local_54 + 1) {
      local_58 = 0;
      while ((local_58 < (int)(*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff) &&
             (*(int *)((long)&pFinal[1].pNext + (long)local_58 * 4) != p->pResLits[local_54]))) {
        local_58 = local_58 + 1;
      }
      if ((int)(*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff) <= local_58) break;
    }
    if (local_54 < p->nResLits) {
      printf("Recording clause %d: The final resolvent is wrong.\n",(ulong)(uint)pFinal->Id);
      Int_ManPrintClause(p,pConflict);
      Int_ManPrintResolvent(p->pResLits,p->nResLits);
      Int_ManPrintClause(p,pFinal);
    }
    if (p->nResLits != (*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff)) {
      for (local_54 = 0; local_54 < (int)(*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff);
          local_54 = local_54 + 1) {
        for (local_58 = 0;
            (local_58 < p->nResLits &&
            (*(int *)((long)&pFinal[1].pNext + (long)local_54 * 4) != p->pResLits[local_58]));
            local_58 = local_58 + 1) {
        }
        if (p->nResLits <= local_58) {
          *(uint *)&pFinal->field_0x1c =
               *(uint *)&pFinal->field_0x1c & 0xf8000007 |
               ((*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff) - 1 & 0xffffff) << 3;
          for (local_58 = local_54; local_58 < (int)(*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff);
              local_58 = local_58 + 1) {
            *(undefined4 *)((long)&pFinal[1].pNext + (long)local_58 * 4) =
                 *(undefined4 *)((long)&pFinal[1].pNext + (long)(local_58 + 1) * 4);
          }
          local_54 = local_54 + -1;
        }
      }
      if (p->nResLits != (*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff)) {
        __assert_fail("p->nResLits == (int)pFinal->nLits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                      ,0x2e7,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
      }
    }
  }
  aVar11 = Abc_Clock();
  p->timeTrace = (aVar11 - aVar8) + p->timeTrace;
  Int_ManProofSet(p,pFinal,p->Counter);
  if (p->pProofNums[pFinal->Id + -1] == p->Counter) {
    __assert_fail("p->pProofNums[pFinal->Id-1] != p->Counter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                  ,0x2f3,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  return p->Counter;
}

Assistant:

int Int_ManProofTraceOne( Int_Man_t * p, Sto_Cls_t * pConflict, Sto_Cls_t * pFinal )
{
    Sto_Cls_t * pReason;
    int i, v, Var, PrevId;
    int fPrint = 0;
    abctime clk = Abc_Clock();

    // collect resolvent literals
    if ( p->fProofVerif )
    {
        assert( (int)pConflict->nLits <= p->nResLitsAlloc );
        memcpy( p->pResLits, pConflict->pLits, sizeof(lit) * pConflict->nLits );
        p->nResLits = pConflict->nLits;
    }

    // mark all the variables in the conflict as seen
    for ( v = 0; v < (int)pConflict->nLits; v++ )
        p->pSeens[lit_var(pConflict->pLits[v])] = 1;

    // start the anticedents
//    pFinal->pAntis = Vec_PtrAlloc( 32 );
//    Vec_PtrPush( pFinal->pAntis, pConflict );

    if ( p->pCnf->nClausesA )
        Int_ManTruthCopy( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pConflict), p->nWords );

    // follow the trail backwards
    PrevId = Int_ManProofGet(p, pConflict);
    for ( i = p->nTrailSize - 1; i >= 0; i-- )
    {
        // skip literals that are not involved
        Var = lit_var(p->pTrail[i]);
        if ( !p->pSeens[Var] )
            continue;
        p->pSeens[Var] = 0;

        // skip literals of the resulting clause
        pReason = p->pReasons[Var];
        if ( pReason == NULL )
            continue;
        assert( p->pTrail[i] == pReason->pLits[0] );

        // add the variables to seen
        for ( v = 1; v < (int)pReason->nLits; v++ )
            p->pSeens[lit_var(pReason->pLits[v])] = 1;


        // record the reason clause
        assert( Int_ManProofGet(p, pReason) > 0 );
        p->Counter++;
        if ( p->fProofWrite )
            fprintf( p->pFile, "%d * %d %d 0\n", p->Counter, PrevId, Int_ManProofGet(p, pReason) );
        PrevId = p->Counter;

        if ( p->pCnf->nClausesA )
        {
            if ( p->pVarTypes[Var] == 1 ) // var of A
                Int_ManTruthOr( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pReason), p->nWords );
            else
                Int_ManTruthAnd( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pReason), p->nWords );
        }
 
        // resolve the temporary resolvent with the reason clause
        if ( p->fProofVerif )
        {
            int v1, v2; 
            if ( fPrint )
                Int_ManPrintResolvent( p->pResLits, p->nResLits );
            // check that the var is present in the resolvent
            for ( v1 = 0; v1 < p->nResLits; v1++ )
                if ( lit_var(p->pResLits[v1]) == Var )
                    break;
            if ( v1 == p->nResLits )
                printf( "Recording clause %d: Cannot find variable %d in the temporary resolvent.\n", pFinal->Id, Var );
            if ( p->pResLits[v1] != lit_neg(pReason->pLits[0]) )
                printf( "Recording clause %d: The resolved variable %d is in the wrong polarity.\n", pFinal->Id, Var );
            // remove this variable from the resolvent
            assert( lit_var(p->pResLits[v1]) == Var );
            p->nResLits--;
            for ( ; v1 < p->nResLits; v1++ )
                p->pResLits[v1] = p->pResLits[v1+1];
            // add variables of the reason clause
            for ( v2 = 1; v2 < (int)pReason->nLits; v2++ )
            {
                for ( v1 = 0; v1 < p->nResLits; v1++ )
                    if ( lit_var(p->pResLits[v1]) == lit_var(pReason->pLits[v2]) )
                        break;
                // if it is a new variable, add it to the resolvent
                if ( v1 == p->nResLits ) 
                {
                    if ( p->nResLits == p->nResLitsAlloc )
                        printf( "Recording clause %d: Ran out of space for intermediate resolvent.\n", pFinal->Id );
                    p->pResLits[ p->nResLits++ ] = pReason->pLits[v2];
                    continue;
                }
                // if the variable is the same, the literal should be the same too
                if ( p->pResLits[v1] == pReason->pLits[v2] )
                    continue;
                // the literal is different
                printf( "Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n", pFinal->Id );
            }
        }

//        Vec_PtrPush( pFinal->pAntis, pReason );
    }

    // unmark all seen variables
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        p->pSeens[lit_var(p->pTrail[i])] = 0;
    // check that the literals are unmarked
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        assert( p->pSeens[lit_var(p->pTrail[i])] == 0 );

    // use the resulting clause to check the correctness of resolution
    if ( p->fProofVerif )
    {
        int v1, v2; 
        if ( fPrint )
            Int_ManPrintResolvent( p->pResLits, p->nResLits );
        for ( v1 = 0; v1 < p->nResLits; v1++ )
        {
            for ( v2 = 0; v2 < (int)pFinal->nLits; v2++ )
                if ( pFinal->pLits[v2] == p->pResLits[v1] )
                    break;
            if ( v2 < (int)pFinal->nLits )
                continue;
            break;
        }
        if ( v1 < p->nResLits )
        {
            printf( "Recording clause %d: The final resolvent is wrong.\n", pFinal->Id );
            Int_ManPrintClause( p, pConflict );
            Int_ManPrintResolvent( p->pResLits, p->nResLits );
            Int_ManPrintClause( p, pFinal );
        }

        // if there are literals in the clause that are not in the resolvent
        // it means that the derived resolvent is stronger than the clause
        // we can replace the clause with the resolvent by removing these literals
        if ( p->nResLits != (int)pFinal->nLits )
        {
            for ( v1 = 0; v1 < (int)pFinal->nLits; v1++ )
            {
                for ( v2 = 0; v2 < p->nResLits; v2++ )
                    if ( pFinal->pLits[v1] == p->pResLits[v2] )
                        break;
                if ( v2 < p->nResLits )
                    continue;
                // remove literal v1 from the final clause
                pFinal->nLits--;
                for ( v2 = v1; v2 < (int)pFinal->nLits; v2++ )
                    pFinal->pLits[v2] = pFinal->pLits[v2+1];
                v1--;
            }
            assert( p->nResLits == (int)pFinal->nLits );
        }
    }
p->timeTrace += Abc_Clock() - clk;

    // return the proof pointer 
    if ( p->pCnf->nClausesA )
    {
//        Int_ManPrintInterOne( p, pFinal );
    }
    Int_ManProofSet( p, pFinal, p->Counter );
    // make sure the same proof ID is not asssigned to two consecutive clauses
    assert( p->pProofNums[pFinal->Id-1] != p->Counter );
    return p->Counter;
}